

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundaryElementModel.cpp
# Opt level: O2

size_t __thiscall OpenMD::BoundaryElementModel::assignElements(BoundaryElementModel *this)

{
  Shape *pSVar1;
  int iVar2;
  Mesh *m;
  size_t sVar3;
  
  pSVar1 = (this->super_ApproximateModel).super_HydrodynamicsModel.shape_;
  if (pSVar1 == (Shape *)0x0) {
    sVar3 = 0;
  }
  else {
    iVar2 = (*pSVar1->_vptr_Shape[9])();
    if ((char)iVar2 == '\0') {
      memcpy(&painCave,
             "BoundaryElementModel::assignElements Error: No mesh was given as the shape\n",0x4c);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
    else {
      pSVar1 = (this->super_ApproximateModel).super_HydrodynamicsModel.shape_;
      if (pSVar1 == (Shape *)0x0) {
        m = (Mesh *)0x0;
      }
      else {
        m = (Mesh *)__dynamic_cast(pSVar1,&Shape::typeinfo,&Mesh::typeinfo,0);
      }
      createTriangles(this,m);
    }
    sVar3 = ((long)(this->super_ApproximateModel).elements_.
                   super__Vector_base<OpenMD::HydrodynamicsElement,_std::allocator<OpenMD::HydrodynamicsElement>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->super_ApproximateModel).elements_.
                  super__Vector_base<OpenMD::HydrodynamicsElement,_std::allocator<OpenMD::HydrodynamicsElement>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x170;
  }
  return sVar3;
}

Assistant:

std::size_t BoundaryElementModel::assignElements() {
    if (shape_ != NULL) {
      if (shape_->isMesh()) {
        createTriangles(dynamic_cast<Mesh*>(shape_));
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "BoundaryElementModel::assignElements Error: No mesh was "
                 "given as the shape\n");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }
      return elements_.size();
    }
    return 0;
  }